

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

btVector3 __thiscall btSoftBody::evaluateCom(btSoftBody *this)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btVector3 bVar8;
  
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if ((this->m_pose).m_bframe == true) {
    uVar1 = (this->m_nodes).m_size;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    fVar5 = 0.0;
    fVar6 = 0.0;
    lVar2 = 0x10;
    fVar7 = 0.0;
    for (; uVar3 * 4 != uVar4; uVar4 = uVar4 + 4) {
      bVar8 = operator*((btVector3 *)
                        ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                                super_Element.m_tag + lVar2),
                        (btScalar *)((long)(this->m_pose).m_wgh.m_data + uVar4));
      fVar5 = fVar5 + bVar8.m_floats[0];
      fVar6 = fVar6 + bVar8.m_floats[1];
      fVar7 = bVar8.m_floats[2] + fVar7;
      lVar2 = lVar2 + 0x78;
    }
  }
  bVar8.m_floats[1] = fVar6;
  bVar8.m_floats[0] = fVar5;
  bVar8.m_floats[2] = fVar7;
  bVar8.m_floats[3] = 0.0;
  return (btVector3)bVar8.m_floats;
}

Assistant:

btVector3		btSoftBody::evaluateCom() const
{
	btVector3	com(0,0,0);
	if(m_pose.m_bframe)
	{
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			com+=m_nodes[i].m_x*m_pose.m_wgh[i];
		}
	}
	return(com);
}